

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O1

TRef lj_ir_kptr_(jit_State *J,IROp op,void *ptr)

{
  IRIns *pIVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar2 = J->chain[op];
  if (uVar2 != 0) {
    pIVar1 = (J->cur).ir;
    do {
      uVar3 = (uint)uVar2;
      if ((void *)(ulong)pIVar1[uVar2].field_1.op12 == ptr) goto LAB_0012dc08;
      uVar2 = *(ushort *)((long)pIVar1 + (ulong)uVar2 * 8 + 6);
    } while (uVar2 != 0);
  }
  uVar3 = (J->cur).nk;
  if (uVar3 <= J->irbotlim) {
    lj_ir_growbot(J);
  }
  uVar3 = uVar3 - 1;
  uVar4 = (ulong)uVar3;
  (J->cur).nk = uVar3;
  pIVar1 = (J->cur).ir;
  pIVar1[uVar4].field_1.op12 = (IRRef2)ptr;
  *(undefined1 *)((long)pIVar1 + uVar4 * 8 + 4) = 5;
  *(char *)((long)pIVar1 + uVar4 * 8 + 5) = (char)op;
  *(IRRef1 *)((long)pIVar1 + uVar4 * 8 + 6) = J->chain[op];
  J->chain[op] = (IRRef1)uVar3;
LAB_0012dc08:
  return uVar3 + 0x5000000;
}

Assistant:

TRef lj_ir_kptr_(jit_State *J, IROp op, void *ptr)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
  lua_assert((void *)(intptr_t)i32ptr(ptr) == ptr);
  for (ref = J->chain[op]; ref; ref = cir[ref].prev)
    if (mref(cir[ref].ptr, void) == ptr)
      goto found;
  ref = ir_nextk(J);
  ir = IR(ref);
  setmref(ir->ptr, ptr);
  ir->t.irt = IRT_P32;
  ir->o = op;
  ir->prev = J->chain[op];
  J->chain[op] = (IRRef1)ref;
found:
  return TREF(ref, IRT_P32);
}